

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O1

void __thiscall Zuker::get_rna_cai(Zuker *this,string *rna)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int (*paiVar6) [3];
  pointer pcVar7;
  long lVar8;
  int index;
  long lVar9;
  long lVar10;
  
  if (0 < this->n) {
    index = 0;
    do {
      lVar10 = (long)index;
      piVar2 = (this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)piVar2[lVar10];
      if (lVar5 == -1) {
        if (index * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
          lVar9 = (long)index;
          iVar3 = index / 3 + (index >> 0x1f);
          lVar5 = lVar9 + 1;
          lVar8 = (long)piVar2[lVar9 + 1];
          iVar4 = -(index >> 0x1f);
          if (lVar8 == -1) {
            if (piVar2[lVar9 + 2] == -1) {
              iVar1 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3 + iVar4];
              iVar3 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3 + iVar4];
              if (iVar3 == -1) {
                iVar3 = max_cai_pos[iVar1];
              }
              paiVar6 = nucleotides[iVar1] + iVar3;
              (rna->_M_dataplus)._M_p[lVar10] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[(*paiVar6)[0]];
              (rna->_M_dataplus)._M_p[lVar5] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[(*paiVar6)[1]];
              goto LAB_001383e2;
            }
            if (piVar2[lVar9 + 1] != -1) goto LAB_001381a3;
            iVar3 = iVar3 + iVar4;
            iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3];
            if (iVar4 == -1) {
              iVar4 = fill_rna(this,index);
            }
            (rna->_M_dataplus)._M_p[lVar9 + 2] =
                 to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar9 + 2]];
            (rna->_M_dataplus)._M_p[lVar10] =
                 to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [nucleotides
                  [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3]][iVar4][0]];
            paiVar6 = (int (*) [3])
                      (nucleotides
                       [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar3]][iVar4] + 1);
          }
          else {
LAB_001381a3:
            iVar3 = iVar3 + iVar4;
            if (piVar2[lVar9 + 2] == -1) {
              iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3];
              if (iVar4 == -1) {
                iVar4 = fill_rna(this,index);
              }
              (rna->_M_dataplus)._M_p[lVar5] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
              (rna->_M_dataplus)._M_p[lVar10] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [nucleotides
                    [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar3]][iVar4][0]];
              paiVar6 = nucleotides
                        [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar3]] + iVar4;
LAB_001383e2:
              lVar5 = lVar9 + 2;
              paiVar6 = (int (*) [3])(*paiVar6 + 2);
            }
            else {
              iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3];
              if (iVar4 == -1) {
                iVar4 = fill_rna(this,index);
              }
              (rna->_M_dataplus)._M_p[lVar5] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
              (rna->_M_dataplus)._M_p[lVar9 + 2] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9 + 2]];
              paiVar6 = nucleotides
                        [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar3]] + iVar4;
              lVar5 = lVar10;
            }
          }
          (rna->_M_dataplus)._M_p[lVar5] =
               to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[(*paiVar6)[0]];
          index = index + 3;
        }
        lVar5 = (long)index;
        iVar3 = index / 3;
        if (index % 3 == 1) {
          lVar10 = lVar5 + 1;
          lVar8 = (long)(this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5 + 1];
          if (lVar8 == -1) {
            iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3];
            if (iVar4 == -1) {
              iVar4 = fill_rna(this,index);
            }
            (rna->_M_dataplus)._M_p[index] =
                 to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [*(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar3] * 0x48 + 0x1b20a4 +
                          (long)iVar4 * 0xc)];
            pcVar7 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     *(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[iVar3] * 0x48 +
                              0x1b20a8 + (long)iVar4 * 0xc);
          }
          else {
            iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3];
            if (iVar4 == -1) {
              iVar4 = fill_rna(this,index);
            }
            (rna->_M_dataplus)._M_p[lVar10] =
                 to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
            pcVar7 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     *(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[iVar3] * 0x48 +
                              0x1b20a4 + (long)iVar4 * 0xc);
            lVar10 = lVar5;
          }
          (rna->_M_dataplus)._M_p[lVar10] = *pcVar7;
          index = index + 2;
        }
        lVar10 = (long)index;
        if (index % 3 == 2) {
          iVar3 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[index / 3];
          if (iVar3 == -1) {
            iVar3 = fill_rna(this,index);
          }
          lVar5 = (long)*(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[index / 3] * 0x48 +
                                 0x1b20a8 + (long)iVar3 * 0xc);
          goto LAB_00138594;
        }
      }
      else {
LAB_00138594:
        (rna->_M_dataplus)._M_p[lVar10] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar5];
        index = index + 1;
      }
    } while (SBORROW4(index,this->n * 3) != index + this->n * -3 < 0);
  }
  return;
}

Assistant:

void Zuker::get_rna_cai(string & rna) {


    int i = 0;
    while (i < 3*n) {
        if (nucle_seq[i] == -1) {
            if (i % 3 == 0) {
                if (nucle_seq[i+1] == -1 && nucle_seq[i+2] == -1) {
                    int p = protein[i/3];
                    int x = codon_selection[i/3];

                    if (x == -1)
                        x = max_cai_pos[p];
                    rna[i] = to_char[nucleotides[p][x][0]];
                    rna[i+1] = to_char[nucleotides[p][x][1]];
                    rna[i+2] = to_char[nucleotides[p][x][2]];
                    i = i+3;
                }
                else if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+3;
                }
                else if (nucle_seq[i+2] == -1) {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+2] = to_char[nucleotides[protein[i/3]][idx][2]];

                    i = i+3;
                }
                else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];

                    i = i+3;
                }
            }
            if (i % 3 == 1) {
                if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][2]];


                    i = i+2;
                } else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+2;
                }
            }
            if (i % 3 == 2) {

                int idx = codon_selection[i/3];
                if (idx == -1)
                    idx = fill_rna(i);
                rna[i] = to_char[nucleotides[protein[i/3]][idx][2]];

                i++;
            }
        }
        else {
            rna[i] = to_char[nucle_seq[i]];
            i++;
        }
    }
}